

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::addUniform
          (UniformCollection *this,Uniform *uniform)

{
  pointer *ppUVar1;
  Uniform *__first;
  Uniform *__last;
  pointer pcVar2;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  *this_00;
  pointer __result;
  Uniform *pUVar3;
  Uniform *pUVar4;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform> *in_RCX;
  Uniform *in_RDX;
  Uniform *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  pUVar4 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar4 == (this->m_uniforms).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pUVar3 = uniform;
    this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               *)std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                 ::_M_check_len(&this->m_uniforms,(size_type)uniform,(char *)in_RDX);
    __first = (this->m_uniforms).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (this->m_uniforms).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ::_M_allocate(this_00,(size_t)pUVar3);
    std::allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>>
    ::
    construct<deqp::gles31::Functional::(anonymous_namespace)::Uniform,deqp::gles31::Functional::(anonymous_namespace)::Uniform_const&>
              ((allocator_type *)(((long)pUVar4 - (long)__first) + (long)__result),uniform,__args);
    pUVar3 = std::
             __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::Uniform*,deqp::gles31::Functional::(anonymous_namespace)::Uniform*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>>
                       (__first,pUVar4,__result,in_RCX);
    pUVar4 = std::
             __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::Uniform*,deqp::gles31::Functional::(anonymous_namespace)::Uniform*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>>
                       (pUVar4,__last,pUVar3 + 1,in_RCX);
    if (__first != __last) {
      paVar5 = &(__first->name).field_2;
      do {
        glu::VarType::~VarType((VarType *)(paVar5 + 1));
        pcVar2 = (((string *)(paVar5 + -1))->_M_dataplus)._M_p;
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
        }
        pUVar3 = (Uniform *)((long)paVar5 + 0x28);
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar5 + 0x38);
      } while (pUVar3 != __last);
    }
    if (__first != (Uniform *)0x0) {
      operator_delete(__first,(long)(this->m_uniforms).
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (this->m_uniforms).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->m_uniforms).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar4;
    (this->m_uniforms).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    std::allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>>
    ::
    construct<deqp::gles31::Functional::(anonymous_namespace)::Uniform,deqp::gles31::Functional::(anonymous_namespace)::Uniform_const&>
              ((allocator_type *)pUVar4,uniform,in_RDX);
    ppUVar1 = &(this->m_uniforms).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return;
}

Assistant:

void				addUniform			(const Uniform& uniform)		{ m_uniforms.push_back(uniform);	}